

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::InstDebugPrintfPass::GenOutputValues
          (InstDebugPrintfPass *this,Instruction *val_inst,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *val_ids,InstructionBuilder *builder)

{
  byte bVar1;
  Kind KVar2;
  IRContext *this_00;
  TypeManager *this_01;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t cond;
  Type *pTVar7;
  undefined4 extraout_var;
  long lVar8;
  undefined4 extraout_var_01;
  Instruction *this_02;
  Instruction *pIVar9;
  Op OVar10;
  iterator iVar11;
  Instruction *ui32_inst;
  uint uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  undefined4 extraout_var_00;
  
  while( true ) {
    uVar3 = 0;
    if (val_inst->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(val_inst,0);
    }
    this_00 = (this->super_InstrumentPass).super_Pass.context_;
    if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(this_00);
    }
    this_01 = (this_00->type_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    pTVar7 = analysis::TypeManager::GetType(this_01,uVar3);
    KVar2 = pTVar7->kind_;
    if (KVar2 != kFloat) break;
    iVar4 = (*pTVar7->_vptr_Type[0xb])(pTVar7);
    iVar4 = *(int *)(CONCAT44(extraout_var,iVar4) + 0x24);
    if (iVar4 == 0x10) {
      uVar3 = InstrumentPass::GetFloatId(&this->super_InstrumentPass);
      uVar5 = 0;
      if (val_inst->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(val_inst,(uint)val_inst->has_type_id_);
      }
      OVar10 = OpFConvert;
    }
    else {
      if (iVar4 != 0x40) {
        if (iVar4 != 0x20) {
          __assert_fail("false && \"unsupported float width\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp"
                        ,0x4e,
                        "void spvtools::opt::InstDebugPrintfPass::GenOutputValues(Instruction *, std::vector<uint32_t> *, InstructionBuilder *)"
                       );
        }
        uVar3 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
        uVar5 = 0;
        if (val_inst->has_result_id_ == true) {
          uVar5 = Instruction::GetSingleWordOperand(val_inst,(uint)val_inst->has_type_id_);
        }
        OVar10 = OpBitcast;
LAB_002262ca:
        pIVar9 = InstructionBuilder::AddUnaryOp(builder,uVar3,OVar10,uVar5);
LAB_002262cf:
        uVar3 = 0;
        if (pIVar9->has_result_id_ == true) {
          uVar3 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
        }
        local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_58.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,uVar3);
        iVar11._M_current =
             (val_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (val_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
LAB_00226330:
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (val_ids,iVar11,(uint *)&local_58);
        }
        else {
          *iVar11._M_current = uVar3;
LAB_00226326:
          (val_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar11._M_current + 1;
        }
        return;
      }
      uVar3 = InstrumentPass::GetUint64Id(&this->super_InstrumentPass);
      uVar5 = 0;
      if (val_inst->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(val_inst,(uint)val_inst->has_type_id_);
      }
      OVar10 = OpBitcast;
    }
    val_inst = InstructionBuilder::AddUnaryOp(builder,uVar3,OVar10,uVar5);
  }
  if (KVar2 == kBool) {
    uVar3 = InstructionBuilder::GetUintConstantId(builder,0);
    uVar5 = InstructionBuilder::GetUintConstantId(builder,1);
    uVar6 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    cond = 0;
    if (val_inst->has_result_id_ == true) {
      cond = Instruction::GetSingleWordOperand(val_inst,(uint)val_inst->has_type_id_);
    }
    pIVar9 = InstructionBuilder::AddSelect(builder,uVar6,cond,uVar5,uVar3);
    goto LAB_002262cf;
  }
  if (KVar2 != kInteger) {
    local_38 = val_ids;
    if (KVar2 != kVector) {
      __assert_fail("false && \"unsupported type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp"
                    ,0x87,
                    "void spvtools::opt::InstDebugPrintfPass::GenOutputValues(Instruction *, std::vector<uint32_t> *, InstructionBuilder *)"
                   );
    }
    iVar4 = (*pTVar7->_vptr_Type[0xd])(pTVar7);
    lVar8 = CONCAT44(extraout_var_00,iVar4);
    uVar3 = analysis::TypeManager::GetId(this_01,*(Type **)(lVar8 + 0x28));
    if (*(int *)(lVar8 + 0x30) == 0) {
      return;
    }
    uVar12 = 0;
    do {
      uVar5 = 0;
      if (val_inst->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(val_inst,(uint)val_inst->has_type_id_);
      }
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(4);
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
      *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = uVar12;
      local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pIVar9 = InstructionBuilder::AddCompositeExtract(builder,uVar3,uVar5,&local_58);
      if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      GenOutputValues(this,pIVar9,local_38,builder);
      uVar12 = uVar12 + 1;
    } while (uVar12 < *(uint *)(lVar8 + 0x30));
    return;
  }
  iVar4 = (*pTVar7->_vptr_Type[9])(pTVar7);
  lVar8 = CONCAT44(extraout_var_01,iVar4);
  iVar4 = *(int *)(lVar8 + 0x24);
  if (iVar4 == 8) {
    if (*(char *)(lVar8 + 0x28) == '\x01') {
      uVar3 = InstrumentPass::GetUint8Id(&this->super_InstrumentPass);
      uVar5 = 0;
      if (val_inst->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(val_inst,(uint)val_inst->has_type_id_);
      }
      val_inst = InstructionBuilder::AddUnaryOp(builder,uVar3,OpBitcast,uVar5);
    }
    uVar3 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    uVar5 = 0;
    if (val_inst->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(val_inst,(uint)val_inst->has_type_id_);
    }
    OVar10 = OpUConvert;
    goto LAB_002262ca;
  }
  if (iVar4 == 0x20) {
    if (*(char *)(lVar8 + 0x28) == '\x01') {
      uVar3 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
      uVar5 = 0;
      if (val_inst->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(val_inst,(uint)val_inst->has_type_id_);
      }
      val_inst = InstructionBuilder::AddUnaryOp(builder,uVar3,OpBitcast,uVar5);
    }
    uVar3 = 0;
    if (val_inst->has_result_id_ == true) {
      bVar1 = val_inst->has_type_id_;
      goto LAB_00226311;
    }
  }
  else {
    if (iVar4 != 0x40) {
      __assert_fail("false && \"unsupported int width\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inst_debug_printf_pass.cpp"
                    ,0x82,
                    "void spvtools::opt::InstDebugPrintfPass::GenOutputValues(Instruction *, std::vector<uint32_t> *, InstructionBuilder *)"
                   );
    }
    if (*(char *)(lVar8 + 0x28) == '\x01') {
      uVar3 = InstrumentPass::GetUint64Id(&this->super_InstrumentPass);
      uVar5 = 0;
      if (val_inst->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(val_inst,(uint)val_inst->has_type_id_);
      }
      val_inst = InstructionBuilder::AddUnaryOp(builder,uVar3,OpBitcast,uVar5);
    }
    uVar3 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    uVar6 = 0;
    uVar5 = 0;
    if (val_inst->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(val_inst,(uint)val_inst->has_type_id_);
    }
    pIVar9 = InstructionBuilder::AddUnaryOp(builder,uVar3,OpUConvert,uVar5);
    uVar3 = InstrumentPass::GetUint64Id(&this->super_InstrumentPass);
    if (val_inst->has_result_id_ == true) {
      uVar6 = Instruction::GetSingleWordOperand(val_inst,(uint)val_inst->has_type_id_);
    }
    uVar5 = InstructionBuilder::GetUintConstantId(builder,0x20);
    this_02 = InstructionBuilder::AddBinaryOp(builder,uVar3,OpShiftRightLogical,uVar6,uVar5);
    uVar3 = InstrumentPass::GetUintId(&this->super_InstrumentPass);
    uVar6 = 0;
    uVar5 = 0;
    if (this_02->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
    }
    val_inst = InstructionBuilder::AddUnaryOp(builder,uVar3,OpUConvert,uVar5);
    if (pIVar9->has_result_id_ == true) {
      uVar6 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
    }
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,uVar6);
    iVar11._M_current =
         (val_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (val_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (val_ids,iVar11,(uint *)&local_58);
    }
    else {
      *iVar11._M_current = uVar6;
      (val_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar11._M_current + 1;
    }
    uVar3 = 0;
    if (val_inst->has_result_id_ == true) {
      bVar1 = val_inst->has_type_id_;
LAB_00226311:
      uVar3 = Instruction::GetSingleWordOperand(val_inst,(uint)bVar1);
    }
  }
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,uVar3);
  iVar11._M_current =
       (val_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar11._M_current ==
      (val_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) goto LAB_00226330;
  *iVar11._M_current = uVar3;
  goto LAB_00226326;
}

Assistant:

void InstDebugPrintfPass::GenOutputValues(Instruction* val_inst,
                                          std::vector<uint32_t>* val_ids,
                                          InstructionBuilder* builder) {
  uint32_t val_ty_id = val_inst->type_id();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::Type* val_ty = type_mgr->GetType(val_ty_id);
  switch (val_ty->kind()) {
    case analysis::Type::kVector: {
      analysis::Vector* v_ty = val_ty->AsVector();
      const analysis::Type* c_ty = v_ty->element_type();
      uint32_t c_ty_id = type_mgr->GetId(c_ty);
      for (uint32_t c = 0; c < v_ty->element_count(); ++c) {
        Instruction* c_inst =
            builder->AddCompositeExtract(c_ty_id, val_inst->result_id(), {c});
        GenOutputValues(c_inst, val_ids, builder);
      }
      return;
    }
    case analysis::Type::kBool: {
      // Select between uint32 zero or one
      uint32_t zero_id = builder->GetUintConstantId(0);
      uint32_t one_id = builder->GetUintConstantId(1);
      Instruction* sel_inst = builder->AddSelect(
          GetUintId(), val_inst->result_id(), one_id, zero_id);
      val_ids->push_back(sel_inst->result_id());
      return;
    }
    case analysis::Type::kFloat: {
      analysis::Float* f_ty = val_ty->AsFloat();
      switch (f_ty->width()) {
        case 16: {
          // Convert float16 to float32 and recurse
          Instruction* f32_inst = builder->AddUnaryOp(
              GetFloatId(), spv::Op::OpFConvert, val_inst->result_id());
          GenOutputValues(f32_inst, val_ids, builder);
          return;
        }
        case 64: {
          // Bitcast float64 to uint64 and recurse
          Instruction* ui64_inst = builder->AddUnaryOp(
              GetUint64Id(), spv::Op::OpBitcast, val_inst->result_id());
          GenOutputValues(ui64_inst, val_ids, builder);
          return;
        }
        case 32: {
          // Bitcase float32 to uint32
          Instruction* bc_inst = builder->AddUnaryOp(
              GetUintId(), spv::Op::OpBitcast, val_inst->result_id());
          val_ids->push_back(bc_inst->result_id());
          return;
        }
        default:
          assert(false && "unsupported float width");
          return;
      }
    }
    case analysis::Type::kInteger: {
      analysis::Integer* i_ty = val_ty->AsInteger();
      switch (i_ty->width()) {
        case 64: {
          Instruction* ui64_inst = val_inst;
          if (i_ty->IsSigned()) {
            // Bitcast sint64 to uint64
            ui64_inst = builder->AddUnaryOp(GetUint64Id(), spv::Op::OpBitcast,
                                            val_inst->result_id());
          }
          // Break uint64 into 2x uint32
          Instruction* lo_ui64_inst = builder->AddUnaryOp(
              GetUintId(), spv::Op::OpUConvert, ui64_inst->result_id());
          Instruction* rshift_ui64_inst = builder->AddBinaryOp(
              GetUint64Id(), spv::Op::OpShiftRightLogical,
              ui64_inst->result_id(), builder->GetUintConstantId(32));
          Instruction* hi_ui64_inst = builder->AddUnaryOp(
              GetUintId(), spv::Op::OpUConvert, rshift_ui64_inst->result_id());
          val_ids->push_back(lo_ui64_inst->result_id());
          val_ids->push_back(hi_ui64_inst->result_id());
          return;
        }
        case 8: {
          Instruction* ui8_inst = val_inst;
          if (i_ty->IsSigned()) {
            // Bitcast sint8 to uint8
            ui8_inst = builder->AddUnaryOp(GetUint8Id(), spv::Op::OpBitcast,
                                           val_inst->result_id());
          }
          // Convert uint8 to uint32
          Instruction* ui32_inst = builder->AddUnaryOp(
              GetUintId(), spv::Op::OpUConvert, ui8_inst->result_id());
          val_ids->push_back(ui32_inst->result_id());
          return;
        }
        case 32: {
          Instruction* ui32_inst = val_inst;
          if (i_ty->IsSigned()) {
            // Bitcast sint32 to uint32
            ui32_inst = builder->AddUnaryOp(GetUintId(), spv::Op::OpBitcast,
                                            val_inst->result_id());
          }
          // uint32 needs no further processing
          val_ids->push_back(ui32_inst->result_id());
          return;
        }
        default:
          // TODO(greg-lunarg): Support non-32-bit int
          assert(false && "unsupported int width");
          return;
      }
    }
    default:
      assert(false && "unsupported type");
      return;
  }
}